

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

size_t nni_url_decode(uint8_t *out,char *in,size_t max_len)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  byte bVar3;
  ushort **ppuVar4;
  size_t sVar5;
  
  sVar5 = 0;
  do {
    uVar2 = *in;
    if (uVar2 == '\0') {
      return sVar5;
    }
    if (max_len == sVar5) {
      return 0xffffffffffffffff;
    }
    if (uVar2 == '%') {
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (long)(char)((uint8_t *)in)[1] * 2 + 1) & 0x10) == 0) {
        return 0xffffffffffffffff;
      }
      if ((*(byte *)((long)*ppuVar4 + (long)(char)((uint8_t *)in)[2] * 2 + 1) & 0x10) == 0) {
        return 0xffffffffffffffff;
      }
      uVar2 = url_hex_val(((uint8_t *)in)[1]);
      out[sVar5] = uVar2 << 4;
      puVar1 = (uint8_t *)in + 2;
      in = (char *)((uint8_t *)in + 3);
      bVar3 = url_hex_val(*puVar1);
      out[sVar5] = bVar3 | uVar2 << 4;
    }
    else {
      out[sVar5] = uVar2;
      in = (char *)((uint8_t *)in + 1);
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

size_t
nni_url_decode(uint8_t *out, const char *in, size_t max_len)
{
	size_t  len;
	uint8_t c;

	len = 0;
	while ((c = (uint8_t) *in) != '\0') {
		if (len >= max_len) {
			return ((size_t) -1);
		}
		if (c == '%') {
			in++;
			if ((!isxdigit(in[0])) || (!isxdigit(in[1]))) {
				return ((size_t) -1);
			}
			out[len] = url_hex_val(*in++);
			out[len] <<= 4u;
			out[len] += url_hex_val(*in++);
			len++;
		} else {
			out[len++] = c;
			in++;
		}
	}
	return (len);
}